

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void proto3_arena_unittest::TestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *paVar2;
  TestAllTypes *pTVar3;
  bool bVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint uVar7;
  TestAllTypes_NestedEnum TVar8;
  ForeignEnum FVar9;
  TestAllTypes **v1;
  TestAllTypes **v2;
  char *failure_msg;
  LogMessage *pLVar10;
  RepeatedField<int> *pRVar11;
  RepeatedField<int> *pRVar12;
  RepeatedField<long> *pRVar13;
  RepeatedField<long> *pRVar14;
  RepeatedField<unsigned_int> *pRVar15;
  RepeatedField<unsigned_int> *pRVar16;
  RepeatedField<unsigned_long> *pRVar17;
  RepeatedField<unsigned_long> *pRVar18;
  RepeatedField<float> *this;
  RepeatedField<float> *other;
  RepeatedField<double> *this_00;
  RepeatedField<double> *other_00;
  RepeatedField<bool> *this_01;
  RepeatedField<bool> *other_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar19;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar20;
  RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage> *pRVar21;
  RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage> *pRVar22;
  RepeatedPtrField<proto3_arena_unittest::ForeignMessage> *this_02;
  RepeatedPtrField<proto3_arena_unittest::ForeignMessage> *other_02;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *this_03;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *other_03;
  uint32_t *puVar23;
  ulong uVar24;
  Arena *pAVar25;
  TestAllTypes_NestedMessage *pTVar26;
  ForeignMessage *pFVar27;
  ImportMessage *pIVar28;
  PublicImportMessage *pPVar29;
  int64_t iVar30;
  uint64_t uVar31;
  unsigned_long uVar32;
  Cord *pCVar33;
  string *psVar34;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  Voidify local_311;
  double local_310;
  float local_308;
  byte local_301;
  LogMessage local_300;
  Voidify local_2ea;
  byte local_2e9;
  LogMessage local_2e8;
  Voidify local_2d2;
  byte local_2d1;
  LogMessage local_2d0;
  Voidify local_2ba;
  byte local_2b9;
  LogMessage local_2b8;
  Voidify local_2a2;
  byte local_2a1;
  LogMessage local_2a0;
  Voidify local_28a;
  byte local_289;
  LogMessage local_288;
  Voidify local_272;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  uint local_1d8;
  uint32_t cached_has_bits;
  LogMessage local_1c8;
  Voidify local_1b1;
  TestAllTypes *local_1b0;
  Nullable<const_char_*> local_1a8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestAllTypes *from;
  TestAllTypes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_170;
  char *local_168;
  Nullable<const_char_*> local_160;
  CleanupNode *local_158;
  Nullable<const_char_*> local_150;
  char *local_148;
  Nullable<const_char_*> local_140;
  char *local_138;
  Nullable<const_char_*> local_130;
  char *local_128;
  Nullable<const_char_*> local_120;
  Chunk *local_118;
  Nullable<const_char_*> local_110;
  CleanupNode *local_108;
  Nullable<const_char_*> local_100;
  string *local_f8;
  TestAllTypes *local_f0;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_e8;
  string *local_e0;
  TestAllTypes *local_d8;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_d0;
  string *local_c8;
  TestAllTypes *local_c0;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_b8;
  string *local_b0;
  TestAllTypes *local_a8;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_a0;
  string *local_98;
  TestAllTypes *local_90;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_88;
  string *local_80;
  TestAllTypes *local_78;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_70;
  string *local_68;
  TestAllTypes *local_60;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_58;
  string *local_50;
  TestAllTypes *local_48;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_40;
  string *local_38;
  TestAllTypes *local_30;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_28;
  string *local_20;
  TestAllTypes *local_18;
  anon_union_808_1_493b367e_for_TestAllTypes_12 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestAllTypes *)to_msg;
  _this = (TestAllTypes *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_1b0 = (TestAllTypes *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_arena_unittest::TestAllTypes_const*>(&local_1b0);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3_arena_unittest::TestAllTypes*>
                 (&from);
  local_1a8 = absl::lts_20250127::log_internal::
              Check_NEImpl<proto3_arena_unittest::TestAllTypes_const*,proto3_arena_unittest::TestAllTypes*>
                        (v1,v2,"&from != _this");
  if (local_1a8 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_1a8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
               ,0xb3e,failure_msg);
    pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1c8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b1,pLVar10);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_1c8);
  }
  local_1d8 = 0;
  pRVar11 = _internal_mutable_repeated_int32(from);
  pRVar12 = _internal_repeated_int32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar11,pRVar12);
  pRVar13 = _internal_mutable_repeated_int64(from);
  pRVar14 = _internal_repeated_int64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar13,pRVar14);
  pRVar15 = _internal_mutable_repeated_uint32(from);
  pRVar16 = _internal_repeated_uint32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar15,pRVar16);
  pRVar17 = _internal_mutable_repeated_uint64(from);
  pRVar18 = _internal_repeated_uint64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar17,pRVar18);
  pRVar11 = _internal_mutable_repeated_sint32(from);
  pRVar12 = _internal_repeated_sint32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar11,pRVar12);
  pRVar13 = _internal_mutable_repeated_sint64(from);
  pRVar14 = _internal_repeated_sint64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar13,pRVar14);
  pRVar15 = _internal_mutable_repeated_fixed32(from);
  pRVar16 = _internal_repeated_fixed32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar15,pRVar16);
  pRVar17 = _internal_mutable_repeated_fixed64(from);
  pRVar18 = _internal_repeated_fixed64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar17,pRVar18);
  pRVar11 = _internal_mutable_repeated_sfixed32(from);
  pRVar12 = _internal_repeated_sfixed32((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar11,pRVar12);
  pRVar13 = _internal_mutable_repeated_sfixed64(from);
  pRVar14 = _internal_repeated_sfixed64((TestAllTypes *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar13,pRVar14);
  this = _internal_mutable_repeated_float(from);
  other = _internal_repeated_float((TestAllTypes *)arena);
  google::protobuf::RepeatedField<float>::MergeFrom(this,other);
  this_00 = _internal_mutable_repeated_double(from);
  other_00 = _internal_repeated_double((TestAllTypes *)arena);
  google::protobuf::RepeatedField<double>::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_repeated_bool(from);
  other_01 = _internal_repeated_bool((TestAllTypes *)arena);
  google::protobuf::RepeatedField<bool>::MergeFrom(this_01,other_01);
  pRVar19 = _internal_mutable_repeated_string_abi_cxx11_(from);
  pRVar20 = _internal_repeated_string_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar19,pRVar20);
  pRVar19 = _internal_mutable_repeated_bytes_abi_cxx11_(from);
  pRVar20 = _internal_repeated_bytes_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar19,pRVar20);
  pRVar21 = _internal_mutable_repeated_nested_message(from);
  pRVar22 = _internal_repeated_nested_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage>::MergeFrom
            (pRVar21,pRVar22);
  this_02 = _internal_mutable_repeated_foreign_message(from);
  other_02 = _internal_repeated_foreign_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::ForeignMessage>::MergeFrom
            (this_02,other_02);
  this_03 = _internal_mutable_repeated_import_message(from);
  other_03 = _internal_repeated_import_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::MergeFrom
            (this_03,other_03);
  pRVar11 = _internal_mutable_repeated_nested_enum(from);
  pRVar12 = _internal_repeated_nested_enum((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar11,pRVar12);
  pRVar11 = _internal_mutable_repeated_foreign_enum(from);
  pRVar12 = _internal_repeated_foreign_enum((TestAllTypes *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar11,pRVar12);
  pRVar19 = _internal_mutable_repeated_string_piece_abi_cxx11_(from);
  pRVar20 = _internal_repeated_string_piece_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar19,pRVar20);
  pRVar19 = _internal_mutable_repeated_cord_abi_cxx11_(from);
  pRVar20 = _internal_repeated_cord_abi_cxx11_((TestAllTypes *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar19,pRVar20);
  pRVar21 = _internal_mutable_repeated_lazy_message(from);
  pRVar22 = _internal_repeated_lazy_message((TestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage>::MergeFrom
            (pRVar21,pRVar22);
  puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                      ((HasBits<2> *)&(arena->impl_).field_0x10,0);
  local_1d8 = *puVar23;
  if ((local_1d8 & 0xff) != 0) {
    if ((local_1d8 & 1) != 0) {
      _internal_optional_string_abi_cxx11_((TestAllTypes *)arena);
      uVar24 = std::__cxx11::string::empty();
      pTVar3 = from;
      if ((uVar24 & 1) == 0) {
        local_e0 = _internal_optional_string_abi_cxx11_((TestAllTypes *)arena);
        local_d8 = pTVar3;
        local_d0 = &pTVar3->field_0;
        puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                            (&(pTVar3->field_0)._impl_._has_bits_,0);
        psVar34 = local_e0;
        *puVar23 = *puVar23 | 1;
        pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(pTVar3->field_0)._impl_.optional_string_,psVar34,pAVar25);
      }
      else {
        bVar4 = google::protobuf::internal::ArenaStringPtr::IsDefault
                          (&(from->field_0)._impl_.optional_string_);
        pTVar3 = from;
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,anon_var_dwarf_37cdd0 + 5,&local_1f9);
          local_f0 = pTVar3;
          local_f8 = &local_1f8;
          local_e8 = &pTVar3->field_0;
          puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                              (&(local_e8->_impl_)._has_bits_,0);
          psVar34 = local_f8;
          *(byte *)puVar23 = (byte)*puVar23 | 1;
          pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar3->field_0)._impl_.optional_string_,psVar34,pAVar25);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::allocator<char>::~allocator(&local_1f9);
        }
      }
    }
    if ((local_1d8 & 2) != 0) {
      _internal_optional_bytes_abi_cxx11_((TestAllTypes *)arena);
      uVar24 = std::__cxx11::string::empty();
      pTVar3 = from;
      if ((uVar24 & 1) == 0) {
        local_b0 = _internal_optional_bytes_abi_cxx11_((TestAllTypes *)arena);
        local_a8 = pTVar3;
        local_a0 = &pTVar3->field_0;
        puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                            (&(pTVar3->field_0)._impl_._has_bits_,0);
        psVar34 = local_b0;
        *puVar23 = *puVar23 | 2;
        pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(pTVar3->field_0)._impl_.optional_bytes_,psVar34,pAVar25);
      }
      else {
        bVar4 = google::protobuf::internal::ArenaStringPtr::IsDefault
                          (&(from->field_0)._impl_.optional_bytes_);
        pTVar3 = from;
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,anon_var_dwarf_37cdd0 + 5,&local_221);
          local_c0 = pTVar3;
          local_c8 = &local_220;
          local_b8 = &pTVar3->field_0;
          puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                              (&(local_b8->_impl_)._has_bits_,0);
          psVar34 = local_c8;
          *(byte *)puVar23 = (byte)*puVar23 | 2;
          pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar3->field_0)._impl_.optional_bytes_,psVar34,pAVar25);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
        }
      }
    }
    if ((local_1d8 & 4) != 0) {
      _internal_optional_string_piece_abi_cxx11_((TestAllTypes *)arena);
      uVar24 = std::__cxx11::string::empty();
      pTVar3 = from;
      if ((uVar24 & 1) == 0) {
        local_80 = _internal_optional_string_piece_abi_cxx11_((TestAllTypes *)arena);
        local_78 = pTVar3;
        local_70 = &pTVar3->field_0;
        puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                            (&(pTVar3->field_0)._impl_._has_bits_,0);
        psVar34 = local_80;
        *puVar23 = *puVar23 | 4;
        pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(pTVar3->field_0)._impl_.optional_string_piece_,psVar34,pAVar25);
      }
      else {
        bVar4 = google::protobuf::internal::ArenaStringPtr::IsDefault
                          (&(from->field_0)._impl_.optional_string_piece_);
        pTVar3 = from;
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,anon_var_dwarf_37cdd0 + 5,&local_249);
          local_90 = pTVar3;
          local_98 = &local_248;
          local_88 = &pTVar3->field_0;
          puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                              (&(local_88->_impl_)._has_bits_,0);
          psVar34 = local_98;
          *(byte *)puVar23 = (byte)*puVar23 | 4;
          pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar3->field_0)._impl_.optional_string_piece_,psVar34,pAVar25);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
        }
      }
    }
    if ((local_1d8 & 8) != 0) {
      _internal_optional_cord_abi_cxx11_((TestAllTypes *)arena);
      uVar24 = std::__cxx11::string::empty();
      pTVar3 = from;
      if ((uVar24 & 1) == 0) {
        local_50 = _internal_optional_cord_abi_cxx11_((TestAllTypes *)arena);
        local_48 = pTVar3;
        local_40 = &pTVar3->field_0;
        puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                            (&(pTVar3->field_0)._impl_._has_bits_,0);
        psVar34 = local_50;
        *puVar23 = *puVar23 | 8;
        pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(pTVar3->field_0)._impl_.optional_cord_,psVar34,pAVar25);
      }
      else {
        bVar4 = google::protobuf::internal::ArenaStringPtr::IsDefault
                          (&(from->field_0)._impl_.optional_cord_);
        pTVar3 = from;
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,anon_var_dwarf_37cdd0 + 5,&local_271);
          local_60 = pTVar3;
          local_68 = &local_270;
          local_58 = &pTVar3->field_0;
          puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                              (&(local_58->_impl_)._has_bits_,0);
          psVar34 = local_68;
          *(byte *)puVar23 = (byte)*puVar23 | 8;
          pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar3->field_0)._impl_.optional_cord_,psVar34,pAVar25);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
        }
      }
    }
    if ((local_1d8 & 0x10) != 0) {
      local_289 = 0;
      if (arena[3].impl_.first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_288,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xb84,"from._impl_.optional_nested_message_ != nullptr");
        local_289 = 1;
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_288);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_272,pLVar10);
      }
      if ((local_289 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_288);
      }
      if ((from->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
        local_148 = arena[3].impl_.first_arena_.limit_;
        local_140 = absl_log_internal_check_op_result;
        pTVar26 = (TestAllTypes_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_148);
        (from->field_0)._impl_.optional_nested_message_ = pTVar26;
      }
      else {
        proto3_arena_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_nested_message_,
                   (TestAllTypes_NestedMessage *)arena[3].impl_.first_arena_.limit_);
      }
    }
    if ((local_1d8 & 0x20) != 0) {
      local_2a1 = 0;
      if (arena[3].impl_.first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xb8c,"from._impl_.optional_foreign_message_ != nullptr");
        local_2a1 = 1;
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_28a,pLVar10);
      }
      if ((local_2a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2a0);
      }
      if ((from->field_0)._impl_.optional_foreign_message_ == (ForeignMessage *)0x0) {
        local_138 = arena[3].impl_.first_arena_.prefetch_ptr_;
        local_130 = absl_log_internal_check_op_result;
        pFVar27 = (ForeignMessage *)
                  google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::ForeignMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_138);
        (from->field_0)._impl_.optional_foreign_message_ = pFVar27;
      }
      else {
        proto3_arena_unittest::ForeignMessage::MergeFrom
                  ((from->field_0)._impl_.optional_foreign_message_,
                   (ForeignMessage *)arena[3].impl_.first_arena_.prefetch_ptr_);
      }
    }
    if ((local_1d8 & 0x40) != 0) {
      local_2b9 = 0;
      if (arena[3].impl_.first_arena_.cleanup_list_.head_ == (Chunk *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xb94,"from._impl_.optional_import_message_ != nullptr");
        local_2b9 = 1;
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2a2,pLVar10);
      }
      if ((local_2b9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2b8);
      }
      if ((from->field_0)._impl_.optional_import_message_ == (ImportMessage *)0x0) {
        local_118 = arena[3].impl_.first_arena_.cleanup_list_.head_;
        local_110 = absl_log_internal_check_op_result;
        pIVar28 = (ImportMessage *)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_118);
        (from->field_0)._impl_.optional_import_message_ = pIVar28;
      }
      else {
        proto2_unittest_import::ImportMessage::MergeFrom
                  ((from->field_0)._impl_.optional_import_message_,
                   (ImportMessage *)arena[3].impl_.first_arena_.cleanup_list_.head_);
      }
    }
    if ((local_1d8 & 0x80) != 0) {
      local_2d1 = 0;
      if (arena[3].impl_.first_arena_.cleanup_list_.next_ == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xb9c,"from._impl_.optional_public_import_message_ != nullptr");
        local_2d1 = 1;
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2d0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2ba,pLVar10);
      }
      if ((local_2d1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2d0);
      }
      if ((from->field_0)._impl_.optional_public_import_message_ == (PublicImportMessage *)0x0) {
        local_108 = arena[3].impl_.first_arena_.cleanup_list_.next_;
        local_100 = absl_log_internal_check_op_result;
        pPVar29 = (PublicImportMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest_import::PublicImportMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_108);
        (from->field_0)._impl_.optional_public_import_message_ = pPVar29;
      }
      else {
        proto2_unittest_import::PublicImportMessage::MergeFrom
                  ((from->field_0)._impl_.optional_public_import_message_,
                   (PublicImportMessage *)arena[3].impl_.first_arena_.cleanup_list_.next_);
      }
    }
  }
  if ((local_1d8 & 0xff00) != 0) {
    if ((local_1d8 & 0x100) != 0) {
      local_2e9 = 0;
      if (arena[3].impl_.first_arena_.cleanup_list_.limit_ == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xba6,"from._impl_.optional_lazy_message_ != nullptr");
        local_2e9 = 1;
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2e8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2d2,pLVar10);
      }
      if ((local_2e9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2e8);
      }
      if ((from->field_0)._impl_.optional_lazy_message_ == (TestAllTypes_NestedMessage *)0x0) {
        local_158 = arena[3].impl_.first_arena_.cleanup_list_.limit_;
        local_150 = absl_log_internal_check_op_result;
        pTVar26 = (TestAllTypes_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_158);
        (from->field_0)._impl_.optional_lazy_message_ = pTVar26;
      }
      else {
        proto3_arena_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_lazy_message_,
                   (TestAllTypes_NestedMessage *)arena[3].impl_.first_arena_.cleanup_list_.limit_);
      }
    }
    if ((local_1d8 & 0x200) != 0) {
      local_301 = 0;
      if (arena[3].impl_.first_arena_.cleanup_list_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_300,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xbae,"from._impl_.optional_unverified_lazy_message_ != nullptr");
        local_301 = 1;
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_300);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2ea,pLVar10);
      }
      if ((local_301 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_300);
      }
      if ((from->field_0)._impl_.optional_unverified_lazy_message_ ==
          (TestAllTypes_NestedMessage *)0x0) {
        local_168 = arena[3].impl_.first_arena_.cleanup_list_.prefetch_ptr_;
        local_160 = absl_log_internal_check_op_result;
        pTVar26 = (TestAllTypes_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_168);
        (from->field_0)._impl_.optional_unverified_lazy_message_ = pTVar26;
      }
      else {
        proto3_arena_unittest::TestAllTypes_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_unverified_lazy_message_,
                   (TestAllTypes_NestedMessage *)
                   arena[3].impl_.first_arena_.cleanup_list_.prefetch_ptr_);
      }
    }
    if (((local_1d8 & 0x400) != 0) &&
       (iVar30 = _internal_optional_int64((TestAllTypes *)arena), iVar30 != 0)) {
      *(__pointer_type *)((long)&from->field_0 + 0x250) =
           arena[3].impl_.first_arena_.string_block_._M_b._M_p;
    }
    if (((local_1d8 & 0x800) != 0) &&
       (iVar5 = _internal_optional_int32((TestAllTypes *)arena), iVar5 != 0)) {
      (from->field_0)._impl_.optional_int32_ =
           (int32_t)arena[3].impl_.first_arena_.string_block_unused_.
                    super___atomic_base<unsigned_long>._M_i;
    }
    if (((local_1d8 & 0x1000) != 0) &&
       (uVar6 = _internal_optional_uint32((TestAllTypes *)arena), uVar6 != 0)) {
      (from->field_0)._impl_.optional_uint32_ =
           *(uint32_t *)
            ((long)&arena[3].impl_.first_arena_.string_block_unused_.
                    super___atomic_base<unsigned_long>._M_i + 4);
    }
    if (((local_1d8 & 0x2000) != 0) &&
       (uVar31 = _internal_optional_uint64((TestAllTypes *)arena), uVar31 != 0)) {
      *(__pointer_type *)((long)&from->field_0 + 0x260) =
           arena[3].impl_.first_arena_.head_._M_b._M_p;
    }
    if (((local_1d8 & 0x4000) != 0) &&
       (iVar30 = _internal_optional_sint64((TestAllTypes *)arena), iVar30 != 0)) {
      *(__int_type_conflict2 *)((long)&from->field_0 + 0x268) =
           arena[3].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
    if (((local_1d8 & 0x8000) != 0) &&
       (iVar5 = _internal_optional_sint32((TestAllTypes *)arena), iVar5 != 0)) {
      (from->field_0)._impl_.optional_sint32_ =
           (int32_t)arena[3].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                    _M_i;
    }
  }
  if ((local_1d8 & 0xff0000) != 0) {
    if (((local_1d8 & 0x10000) != 0) &&
       (uVar6 = _internal_optional_fixed32((TestAllTypes *)arena), uVar6 != 0)) {
      (from->field_0)._impl_.optional_fixed32_ =
           *(uint32_t *)
            ((long)&arena[3].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                    _M_i + 4);
    }
    if (((local_1d8 & 0x20000) != 0) &&
       (uVar31 = _internal_optional_fixed64((TestAllTypes *)arena), uVar31 != 0)) {
      (from->field_0)._impl_.optional_fixed64_ = (uint64_t)arena[3].impl_.first_arena_.parent_;
    }
    if (((local_1d8 & 0x40000) != 0) &&
       (iVar30 = _internal_optional_sfixed64((TestAllTypes *)arena), iVar30 != 0)) {
      (from->field_0)._impl_.optional_sfixed64_ =
           *(int64_t *)&arena[3].impl_.first_arena_.cached_block_length_;
    }
    if (((local_1d8 & 0x80000) != 0) &&
       (iVar5 = _internal_optional_sfixed32((TestAllTypes *)arena), iVar5 != 0)) {
      (from->field_0)._impl_.optional_sfixed32_ =
           *(int32_t *)&arena[3].impl_.first_arena_.cached_blocks_;
    }
    if ((local_1d8 & 0x100000) != 0) {
      local_308 = _internal_optional_float((TestAllTypes *)arena);
      uVar7 = absl::lts_20250127::bit_cast<unsigned_int,_float,_0>(&local_308);
      if (uVar7 != 0) {
        (from->field_0)._impl_.optional_float_ =
             *(float *)((long)&arena[3].impl_.first_arena_.cached_blocks_ + 4);
      }
    }
    if ((local_1d8 & 0x200000) != 0) {
      local_310 = _internal_optional_double((TestAllTypes *)arena);
      uVar32 = absl::lts_20250127::bit_cast<unsigned_long,_double,_0>(&local_310);
      if (uVar32 != 0) {
        (from->field_0)._impl_.optional_double_ = (double)arena[4].impl_.tag_and_id_;
      }
    }
    if (((local_1d8 & 0x400000) != 0) &&
       (bVar4 = _internal_optional_bool((TestAllTypes *)arena), bVar4)) {
      (from->field_0)._impl_.optional_bool_ = (bool)((byte)arena[4].impl_.alloc_policy_.policy_ & 1)
      ;
    }
    if (((local_1d8 & 0x800000) != 0) &&
       (TVar8 = _internal_optional_nested_enum((TestAllTypes *)arena),
       TVar8 != TestAllTypes_NestedEnum_ZERO)) {
      (from->field_0)._impl_.optional_nested_enum_ =
           *(int *)((long)&arena[4].impl_.alloc_policy_.policy_ + 4);
    }
  }
  if ((local_1d8 & 0xff000000) != 0) {
    if (((local_1d8 & 0x1000000) != 0) &&
       (FVar9 = _internal_optional_foreign_enum((TestAllTypes *)arena), FVar9 != FOREIGN_ZERO)) {
      (from->field_0)._impl_.optional_foreign_enum_ = *(int *)&arena[4].impl_.field_0x10;
    }
    if ((local_1d8 & 0x2000000) != 0) {
      (from->field_0)._impl_.proto3_optional_float_ = *(float *)&arena[4].impl_.field_0x14;
    }
    if ((local_1d8 & 0x4000000) != 0) {
      pCVar33 = _internal_optional_bytes_cord((TestAllTypes *)arena);
      bVar4 = absl::lts_20250127::Cord::empty(pCVar33);
      pTVar3 = from;
      if (!bVar4) {
        pCVar33 = _internal_optional_bytes_cord((TestAllTypes *)arena);
        _internal_set_optional_bytes_cord(pTVar3,pCVar33);
      }
    }
    pTVar3 = from;
    if ((local_1d8 & 0x8000000) != 0) {
      local_38 = _internal_proto3_optional_string_abi_cxx11_((TestAllTypes *)arena);
      local_30 = pTVar3;
      local_28 = &pTVar3->field_0;
      puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar3->field_0)._impl_._has_bits_,0);
      psVar34 = local_38;
      *puVar23 = *puVar23 | 0x8000000;
      pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar3->field_0)._impl_.proto3_optional_string_,psVar34,pAVar25);
    }
    pTVar3 = from;
    if ((local_1d8 & 0x10000000) != 0) {
      local_20 = _internal_proto3_optional_bytes_abi_cxx11_((TestAllTypes *)arena);
      local_18 = pTVar3;
      local_10 = &pTVar3->field_0;
      puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar3->field_0)._impl_._has_bits_,0);
      psVar34 = local_20;
      *puVar23 = *puVar23 | 0x10000000;
      pAVar25 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar3->field_0)._impl_.proto3_optional_bytes_,psVar34,pAVar25);
    }
    if ((local_1d8 & 0x20000000) != 0) {
      if (arena[4].impl_.first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0xc13,"from._impl_.optional_lazy_import_message_ != nullptr");
        pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&oneof_from_case);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_311,pLVar10);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case);
      }
      if ((from->field_0)._impl_.optional_lazy_import_message_ == (ImportMessage *)0x0) {
        local_128 = arena[4].impl_.first_arena_.limit_;
        local_120 = absl_log_internal_check_op_result;
        pIVar28 = (ImportMessage *)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_128);
        (from->field_0)._impl_.optional_lazy_import_message_ = pIVar28;
      }
      else {
        proto2_unittest_import::ImportMessage::MergeFrom
                  ((from->field_0)._impl_.optional_lazy_import_message_,
                   (ImportMessage *)arena[4].impl_.first_arena_.limit_);
      }
    }
    if ((local_1d8 & 0x40000000) != 0) {
      (from->field_0)._impl_.proto3_optional_int64_ =
           (int64_t)arena[4].impl_.first_arena_.prefetch_ptr_;
    }
    if ((local_1d8 & 0x80000000) != 0) {
      (from->field_0)._impl_.proto3_optional_int32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.cleanup_list_.head_;
    }
  }
  puVar23 = google::protobuf::internal::HasBits<2>::operator[]
                      ((HasBits<2> *)&(arena->impl_).field_0x10,1);
  local_1d8 = *puVar23;
  if ((local_1d8 & 0xff) != 0) {
    if ((local_1d8 & 1) != 0) {
      (from->field_0)._impl_.proto3_optional_uint32_ =
           *(uint32_t *)((long)&arena[4].impl_.first_arena_.cleanup_list_.head_ + 4);
    }
    if ((local_1d8 & 2) != 0) {
      (from->field_0)._impl_.proto3_optional_uint64_ =
           (uint64_t)arena[4].impl_.first_arena_.cleanup_list_.next_;
    }
    if ((local_1d8 & 4) != 0) {
      (from->field_0)._impl_.proto3_optional_sint64_ =
           (int64_t)arena[4].impl_.first_arena_.cleanup_list_.limit_;
    }
    if ((local_1d8 & 8) != 0) {
      (from->field_0)._impl_.proto3_optional_sint32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.cleanup_list_.prefetch_ptr_;
    }
    if ((local_1d8 & 0x10) != 0) {
      (from->field_0)._impl_.proto3_optional_fixed32_ =
           *(uint32_t *)((long)&arena[4].impl_.first_arena_.cleanup_list_.prefetch_ptr_ + 4);
    }
    if ((local_1d8 & 0x20) != 0) {
      *(__pointer_type *)((long)&from->field_0 + 0x2f8) =
           arena[4].impl_.first_arena_.string_block_._M_b._M_p;
    }
    if ((local_1d8 & 0x40) != 0) {
      *(__int_type_conflict2 *)((long)&from->field_0 + 0x300) =
           arena[4].impl_.first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_1d8 & 0x80) != 0) {
      (from->field_0)._impl_.proto3_optional_sfixed32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.head_._M_b._M_p;
    }
  }
  if ((local_1d8 & 0x300) != 0) {
    if ((local_1d8 & 0x100) != 0) {
      (from->field_0)._impl_.proto3_optional_bool_ =
           (bool)(*(byte *)((long)&arena[4].impl_.first_arena_.head_._M_b._M_p + 4) & 1);
    }
    if ((local_1d8 & 0x200) != 0) {
      *(__int_type_conflict2 *)((long)&from->field_0 + 0x310) =
           arena[4].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
  }
  google::protobuf::internal::HasBits<2>::Or
            (&(from->field_0)._impl_._has_bits_,(HasBits<2> *)&(arena->impl_).field_0x10);
  uVar6 = *(uint32_t *)&arena[4].impl_.first_arena_.parent_;
  if (uVar6 != 0) {
    uVar1 = (from->field_0)._impl_._oneof_case_[0];
    bVar4 = uVar1 != uVar6;
    if (bVar4) {
      if (uVar1 != 0) {
        clear_oneof_field(from);
      }
      (from->field_0)._impl_._oneof_case_[0] = uVar6;
    }
    if (uVar6 != 0) {
      if (uVar6 == 0x6f) {
        *(int *)((long)&from->field_0 + 0x318) =
             (int)arena[4].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>.
                  _M_i;
      }
      else if (uVar6 == 0x70) {
        if (bVar4) {
          to_msg_local = (MessageLite *)
                         arena[4].impl_.first_arena_.space_allocated_.
                         super___atomic_base<unsigned_long>._M_i;
          local_170 = absl_log_internal_check_op_result;
          pTVar26 = (TestAllTypes_NestedMessage *)
                    google::protobuf::Arena::
                    CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                              ((Arena *)absl_log_internal_check_op_result,to_msg_local);
          (from->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar26;
        }
        else {
          proto3_arena_unittest::TestAllTypes_NestedMessage::MergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_nested_message_,
                     (TestAllTypes_NestedMessage *)
                     arena[4].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>
                     ._M_i);
        }
      }
      else if (uVar6 == 0x71) {
        if (bVar4) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar2 = &from->field_0;
        psVar34 = _internal_oneof_string_abi_cxx11_((TestAllTypes *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar2->_impl_).oneof_field_.oneof_string_,psVar34,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar6 == 0x72) {
        if (bVar4) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar2 = &from->field_0;
        psVar34 = _internal_oneof_bytes_abi_cxx11_((TestAllTypes *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar2->_impl_).oneof_field_.oneof_string_,psVar34,
                   (Arena *)absl_log_internal_check_op_result);
      }
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypes*>(&to_msg);
  auto& from = static_cast<const TestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.TestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_optional_string().empty()) {
        _this->_internal_set_optional_string(from._internal_optional_string());
      } else {
        if (_this->_impl_.optional_string_.IsDefault()) {
          _this->_internal_set_optional_string("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_optional_bytes().empty()) {
        _this->_internal_set_optional_bytes(from._internal_optional_bytes());
      } else {
        if (_this->_impl_.optional_bytes_.IsDefault()) {
          _this->_internal_set_optional_bytes("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_optional_string_piece().empty()) {
        _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
      } else {
        if (_this->_impl_.optional_string_piece_.IsDefault()) {
          _this->_internal_set_optional_string_piece("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_optional_cord().empty()) {
        _this->_internal_set_optional_cord(from._internal_optional_cord());
      } else {
        if (_this->_impl_.optional_cord_.IsDefault()) {
          _this->_internal_set_optional_cord("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_optional_int64() != 0) {
        _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_optional_int32() != 0) {
        _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_optional_uint32() != 0) {
        _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_optional_uint64() != 0) {
        _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_optional_sint64() != 0) {
        _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_optional_sint32() != 0) {
        _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_optional_fixed32() != 0) {
        _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_optional_fixed64() != 0) {
        _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_optional_sfixed64() != 0) {
        _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_optional_sfixed32() != 0) {
        _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (::absl::bit_cast<::uint32_t>(from._internal_optional_float()) != 0) {
        _this->_impl_.optional_float_ = from._impl_.optional_float_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(from._internal_optional_double()) != 0) {
        _this->_impl_.optional_double_ = from._impl_.optional_double_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_optional_bool() != 0) {
        _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_optional_nested_enum() != 0) {
        _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_optional_foreign_enum() != 0) {
        _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.proto3_optional_float_ = from._impl_.proto3_optional_float_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (!from._internal_optional_bytes_cord().empty()) {
        _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_proto3_optional_string(from._internal_proto3_optional_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_proto3_optional_bytes(from._internal_proto3_optional_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_import_message_ != nullptr);
      if (_this->_impl_.optional_lazy_import_message_ == nullptr) {
        _this->_impl_.optional_lazy_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_import_message_);
      } else {
        _this->_impl_.optional_lazy_import_message_->MergeFrom(*from._impl_.optional_lazy_import_message_);
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_impl_.proto3_optional_int64_ = from._impl_.proto3_optional_int64_;
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_impl_.proto3_optional_int32_ = from._impl_.proto3_optional_int32_;
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.proto3_optional_uint32_ = from._impl_.proto3_optional_uint32_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.proto3_optional_uint64_ = from._impl_.proto3_optional_uint64_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.proto3_optional_sint64_ = from._impl_.proto3_optional_sint64_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.proto3_optional_sint32_ = from._impl_.proto3_optional_sint32_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.proto3_optional_fixed32_ = from._impl_.proto3_optional_fixed32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.proto3_optional_fixed64_ = from._impl_.proto3_optional_fixed64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.proto3_optional_sfixed64_ = from._impl_.proto3_optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.proto3_optional_sfixed32_ = from._impl_.proto3_optional_sfixed32_;
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.proto3_optional_bool_ = from._impl_.proto3_optional_bool_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.proto3_optional_double_ = from._impl_.proto3_optional_double_;
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}